

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

uniformDVecFunctionPointer __thiscall
gl4cts::GPUShaderFP64Test10::getUniformFunctionForDVec
          (GPUShaderFP64Test10 *this,GLuint argument,functionObject *function_object)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar3;
  undefined4 in_register_00000034;
  
  iVar1 = (*function_object->_vptr_functionObject[4])
                    (function_object,CONCAT44(in_register_00000034,argument));
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (iVar1 < 0xf) {
    lVar3 = 0x14d8;
    if (iVar1 != 4) {
      if (iVar1 != 0xe) {
LAB_0095938b:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Not implemented",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x3864);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar3 = 0x1518;
    }
  }
  else if (iVar1 == 0xf) {
    lVar3 = 0x1558;
  }
  else {
    if (iVar1 != 0x10) goto LAB_0095938b;
    lVar3 = 0x1598;
  }
  return *(uniformDVecFunctionPointer *)(CONCAT44(extraout_var,iVar2) + lVar3);
}

Assistant:

GPUShaderFP64Test10::uniformDVecFunctionPointer GPUShaderFP64Test10::getUniformFunctionForDVec(
	glw::GLuint argument, const functionObject& function_object) const
{
	const Utils::_variable_type argument_type = function_object.getArgumentType(argument);
	const glw::Functions&		gl			  = m_context.getRenderContext().getFunctions();

	switch (argument_type)
	{
	case Utils::VARIABLE_TYPE_DOUBLE:
		return gl.uniform1dv;
		break;
	case Utils::VARIABLE_TYPE_DVEC2:
		return gl.uniform2dv;
		break;
	case Utils::VARIABLE_TYPE_DVEC3:
		return gl.uniform3dv;
		break;
	case Utils::VARIABLE_TYPE_DVEC4:
		return gl.uniform4dv;
		break;
	default:
		TCU_FAIL("Not implemented");
		break;
	}

	return 0;
}